

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O1

void __thiscall Clause::Clause<Clause>(Clause *this,Clause *ps,bool learnt)

{
  uint uVar1;
  ulong uVar2;
  undefined3 in_register_00000011;
  
  this->data[0].x = -2;
  uVar1 = *(uint *)this;
  *(uint *)this = uVar1 & 0xfffffffc;
  *(uint *)this = uVar1 & 0xfc | CONCAT31(in_register_00000011,learnt) | *(uint *)ps & 0xffffff00;
  if (0xff < *(uint *)ps) {
    uVar2 = 0;
    do {
      this->data[uVar2].x = ps->data[uVar2].x;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(uint *)ps >> 8);
  }
  return;
}

Assistant:

explicit Lit(int var, bool sign = false) : x((var + var) + (int)sign) {}